

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O1

void pzshape::TPZShapeTriang::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = (1.0 - *pt->fStore) - pt->fStore[1];
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[1] = *pt->fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[2] = pt->fStore[1];
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *dphi->fElem = -1.0;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[1] = -1.0;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar1] = 1.0;
  if ((lVar1 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar1 + 1] = 0.0;
  if ((0 < lVar1) && (2 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar1 * 2] = 0.0;
    if ((1 < lVar1) && (2 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 1] = 1.0;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeTriang::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		
		phi(0,0) =  1.-pt[0]-pt[1];
		phi(1,0) =  pt[0];
		phi(2,0) =  pt[1];
		dphi(0,0) = -1.;
		dphi(1,0) = -1.;
		dphi(0,1) =  1.;
		dphi(1,1) =  0.;
		dphi(0,2) =  0.;
		dphi(1,2) =  1.;
	}